

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorProto::SharedDtor(DescriptorProto *this)

{
  string *this_00;
  DescriptorProto *this_local;
  
  if ((this->name_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (this_00 = this->name_, this_00 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
  }
  if ((this != default_instance_) && (this->options_ != (MessageOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void DescriptorProto::SharedDtor() {
  if (name_ != &::google::protobuf::internal::kEmptyString) {
    delete name_;
  }
  if (this != default_instance_) {
    delete options_;
  }
}